

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.c
# Opt level: O1

int copy_file_data_block(bsdtar *bsdtar,archive *a,archive *in_a,archive_entry *entry)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  long progress;
  void *buff;
  size_t bytes_read;
  int64_t offset;
  int local_64;
  void *local_48;
  size_t local_40;
  long local_38;
  
  iVar3 = archive_read_data_block(in_a,&local_48,&local_40,&local_38);
  if (iVar3 == 0) {
    pcVar4 = (char *)0x0;
    progress = 0;
    do {
      iVar3 = need_report();
      if (iVar3 != 0) {
        report_write(bsdtar,a,entry,progress);
      }
      uVar7 = local_38 - progress;
      if (uVar7 != 0 && progress <= local_38) {
        if (pcVar4 == (char *)0x0) {
          pcVar4 = bsdtar->buff;
          memset(pcVar4,0,bsdtar->buff_size);
        }
        bVar1 = (long)uVar7 < 1;
        if (0 < (long)uVar7) {
          do {
            uVar8 = bsdtar->buff_size;
            if ((long)uVar7 < (long)bsdtar->buff_size) {
              uVar8 = uVar7;
            }
            uVar5 = archive_write_data(a,pcVar4,uVar8);
            if ((long)uVar5 < 0) {
              pcVar6 = archive_error_string(a);
              lafe_warnc(0,"%s",pcVar6);
              local_64 = -1;
              break;
            }
            if (uVar5 < uVar8) {
              pcVar6 = archive_entry_pathname(entry);
              local_64 = 0;
              lafe_warnc(0,"%s: Truncated write; file may have grown while being archived.",pcVar6);
              break;
            }
            progress = progress + uVar5;
            bVar1 = uVar7 == uVar5 || (long)(uVar7 - uVar5) < 0;
            uVar8 = uVar7 - uVar5;
            bVar2 = (long)uVar5 <= (long)uVar7;
            uVar7 = uVar8;
          } while (uVar8 != 0 && bVar2);
        }
        if (!bVar1) {
          return local_64;
        }
      }
      uVar7 = archive_write_data(a,local_48,local_40);
      if ((long)uVar7 < 0) {
        pcVar4 = archive_error_string(a);
        iVar3 = 0;
        goto LAB_001103c8;
      }
      if (uVar7 < local_40) {
        pcVar4 = archive_entry_pathname(entry);
        lafe_warnc(0,"%s: Truncated write; file may have grown while being archived.",pcVar4);
        return 0;
      }
      progress = progress + uVar7;
      iVar3 = archive_read_data_block(in_a,&local_48,&local_40,&local_38);
    } while (iVar3 == 0);
  }
  local_64 = 0;
  if (iVar3 < -0x14) {
    iVar3 = archive_errno(a);
    pcVar4 = archive_error_string(a);
LAB_001103c8:
    lafe_warnc(iVar3,"%s",pcVar4);
    local_64 = -1;
  }
  return local_64;
}

Assistant:

static int
copy_file_data_block(struct bsdtar *bsdtar, struct archive *a,
    struct archive *in_a, struct archive_entry *entry)
{
	size_t	bytes_read;
	ssize_t	bytes_written;
	int64_t	offset, progress = 0;
	char *null_buff = NULL;
	const void *buff;
	int r;

	while ((r = archive_read_data_block(in_a, &buff,
	    &bytes_read, &offset)) == ARCHIVE_OK) {
		if (need_report())
			report_write(bsdtar, a, entry, progress);

		if (offset > progress) {
			int64_t sparse = offset - progress;
			size_t ns;

			if (null_buff == NULL) {
				null_buff = bsdtar->buff;
				memset(null_buff, 0, bsdtar->buff_size);
			}

			while (sparse > 0) {
				if (sparse > (int64_t)bsdtar->buff_size)
					ns = bsdtar->buff_size;
				else
					ns = (size_t)sparse;
				bytes_written =
				    archive_write_data(a, null_buff, ns);
				if (bytes_written < 0) {
					/* Write failed; this is bad */
					lafe_warnc(0, "%s",
					     archive_error_string(a));
					return (-1);
				}
				if ((size_t)bytes_written < ns) {
					/* Write was truncated; warn but
					 * continue. */
					lafe_warnc(0,
					    "%s: Truncated write; file may "
					    "have grown while being archived.",
					    archive_entry_pathname(entry));
					return (0);
				}
				progress += bytes_written;
				sparse -= bytes_written;
			}
		}

		bytes_written = archive_write_data(a, buff, bytes_read);
		if (bytes_written < 0) {
			/* Write failed; this is bad */
			lafe_warnc(0, "%s", archive_error_string(a));
			return (-1);
		}
		if ((size_t)bytes_written < bytes_read) {
			/* Write was truncated; warn but continue. */
			lafe_warnc(0,
			    "%s: Truncated write; file may have grown "
			    "while being archived.",
			    archive_entry_pathname(entry));
			return (0);
		}
		progress += bytes_written;
	}
	if (r < ARCHIVE_WARN) {
		lafe_warnc(archive_errno(a), "%s", archive_error_string(a));
		return (-1);
	}
	return (0);
}